

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<char,_std::char_traits<char>_> *stream,uint options,xml_encoding encoding)

{
  xml_encoding encoding_local;
  uint options_local;
  basic_istream<char,_std::char_traits<char>_> *stream_local;
  xml_document *this_local;
  
  reset(this);
  impl::anon_unknown_0::load_stream_impl<char>
            (__return_storage_ptr__,(xml_document_struct *)(this->super_xml_node)._root,stream,
             options,encoding,&this->_buffer);
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<char, std::char_traits<char> >& stream, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding, &_buffer);
	}